

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::CollationIterator::appendNumericCEs
          (CollationIterator *this,uint32_t ce32,UBool forward,UErrorCode *errorCode)

{
  int iVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  CharString digits;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&digits.buffer);
  digits.len = 0;
  *digits.buffer.ptr = '\0';
  if (forward == '\0') {
    do {
      CharString::append(&digits,(byte)(ce32 >> 8) & 0xf,errorCode);
      iVar3 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
      if (iVar3 < 0) goto LAB_0023f452;
      ce32 = CollationData::getCE32(this->data,iVar3);
      if (ce32 == 0xc0) {
        ce32 = CollationData::getCE32(this->data->base,iVar3);
      }
    } while ((ce32 & 0xcf) == 0xca);
    (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
LAB_0023f452:
    pcVar6 = digits.buffer.ptr + digits.len;
    for (pcVar4 = digits.buffer.ptr; pcVar6 = pcVar6 + -1, pcVar4 < pcVar6; pcVar4 = pcVar4 + 1) {
      cVar2 = *pcVar4;
      *pcVar4 = *pcVar6;
      *pcVar6 = cVar2;
    }
  }
  else {
    while( true ) {
      CharString::append(&digits,(byte)(ce32 >> 8) & 0xf,errorCode);
      if ((this->numCpFwd == 0) ||
         (iVar3 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode), iVar3 < 0))
      goto LAB_0023f487;
      ce32 = CollationData::getCE32(this->data,iVar3);
      if (ce32 == 0xc0) {
        ce32 = CollationData::getCE32(this->data->base,iVar3);
      }
      if ((ce32 & 0xcf) != 0xca) break;
      if (0 < this->numCpFwd) {
        this->numCpFwd = this->numCpFwd + -1;
      }
    }
    (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
  }
LAB_0023f487:
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = 0;
    do {
      iVar1 = digits.len + -1;
      lVar5 = (long)iVar3;
      iVar7 = iVar1;
      if (iVar1 < iVar3) {
        iVar7 = iVar3;
      }
      for (; lVar5 < iVar1; lVar5 = lVar5 + 1) {
        if (digits.buffer.ptr[lVar5] != '\0') {
          iVar7 = (int)lVar5;
          break;
        }
      }
      iVar3 = digits.len - iVar7;
      if (0xfd < digits.len - iVar7) {
        iVar3 = 0xfe;
      }
      appendNumericSegmentCEs(this,digits.buffer.ptr + iVar7,iVar3,errorCode);
    } while ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (iVar3 = iVar3 + iVar7, iVar3 < digits.len))
    ;
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&digits.buffer);
  return;
}

Assistant:

void
CollationIterator::appendNumericCEs(uint32_t ce32, UBool forward, UErrorCode &errorCode) {
    // Collect digits.
    CharString digits;
    if(forward) {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            if(numCpFwd == 0) { break; }
            UChar32 c = nextCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                backwardNumCodePoints(1, errorCode);
                break;
            }
            if(numCpFwd > 0) { --numCpFwd; }
        }
    } else {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            UChar32 c = previousCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                forwardNumCodePoints(1, errorCode);
                break;
            }
        }
        // Reverse the digit string.
        char *p = digits.data();
        char *q = p + digits.length() - 1;
        while(p < q) {
            char digit = *p;
            *p++ = *q;
            *q-- = digit;
        }
    }
    if(U_FAILURE(errorCode)) { return; }
    int32_t pos = 0;
    do {
        // Skip leading zeros.
        while(pos < (digits.length() - 1) && digits[pos] == 0) { ++pos; }
        // Write a sequence of CEs for at most 254 digits at a time.
        int32_t segmentLength = digits.length() - pos;
        if(segmentLength > 254) { segmentLength = 254; }
        appendNumericSegmentCEs(digits.data() + pos, segmentLength, errorCode);
        pos += segmentLength;
    } while(U_SUCCESS(errorCode) && pos < digits.length());
}